

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

void henson_save_size_t(char *name,size_t x)

{
  char *in_RDI;
  Value v;
  variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff18;
  NameMap *this;
  unsigned_long *in_stack_ffffffffffffff28;
  variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff30;
  allocator *value;
  string *in_stack_ffffffffffffff38;
  NameMap *in_stack_ffffffffffffff40;
  allocator local_71;
  string local_70 [104];
  char *local_8;
  
  if (namemap != (NameMap *)0x0) {
    local_8 = in_RDI;
    mpark::
    variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant<unsigned_long_&,_unsigned_long,_0,_0,_0,_1UL,_unsigned_long,_0>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    value = &local_71;
    this = namemap;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,local_8,value);
    mpark::
    variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,in_stack_ffffffffffffff18);
    henson::NameMap::add(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(Value *)value);
    mpark::
    variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x14c5ed);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    mpark::
    variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x14c60e);
  }
  return;
}

Assistant:

void
henson_save_size_t(const char* name, size_t  x)
{
    if (!namemap) return;
    henson::Value v = x;
    namemap->add(name, v);
}